

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

uint64_t reverse_bits_64(uint64_t x,int n)

{
  uint64_t mask;
  int local_18;
  int sh;
  int i;
  int n_local;
  uint64_t x_local;
  
  _i = bswap64(x);
  mask._4_4_ = 4;
  for (local_18 = 2; n <= local_18; local_18 = local_18 + -1) {
    _i = (_i & even_bit_esz_masks[local_18]) << (sbyte)mask._4_4_ |
         _i >> (sbyte)mask._4_4_ & even_bit_esz_masks[local_18];
    mask._4_4_ = mask._4_4_ >> 1;
  }
  return _i;
}

Assistant:

static uint64_t reverse_bits_64(uint64_t x, int n)
{
    int i, sh;

    x = bswap64(x);
    for (i = 2, sh = 4; i >= n; i--, sh >>= 1) {
        uint64_t mask = even_bit_esz_masks[i];
        x = ((x & mask) << sh) | ((x >> sh) & mask);
    }
    return x;
}